

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O0

void __thiscall
slang::ast::DistExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
          (DistExpression *this,MonitorVisitor *visitor)

{
  bool bVar1;
  DistExpression *in_RDI;
  DistItem *item;
  iterator __end3;
  iterator __begin3;
  span<slang::ast::DistExpression::DistItem,_18446744073709551615UL> *__range3;
  Expression *in_stack_ffffffffffffffd0;
  span<slang::ast::DistExpression::DistItem,_18446744073709551615UL> *in_stack_ffffffffffffffd8;
  __normal_iterator<slang::ast::DistExpression::DistItem_*,_std::span<slang::ast::DistExpression::DistItem,_18446744073709551615UL>_>
  local_20;
  span<slang::ast::DistExpression::DistItem,_18446744073709551615UL> *local_18;
  
  left(in_RDI);
  Expression::visit<slang::ast::builtins::MonitorVisitor&>
            (in_stack_ffffffffffffffd0,(MonitorVisitor *)in_RDI);
  local_18 = &in_RDI->items_;
  local_20._M_current =
       (DistItem *)
       std::span<slang::ast::DistExpression::DistItem,_18446744073709551615UL>::begin
                 ((span<slang::ast::DistExpression::DistItem,_18446744073709551615UL> *)in_RDI);
  std::span<slang::ast::DistExpression::DistItem,_18446744073709551615UL>::end
            (in_stack_ffffffffffffffd8);
  while (bVar1 = __gnu_cxx::
                 operator==<slang::ast::DistExpression::DistItem_*,_std::span<slang::ast::DistExpression::DistItem,_18446744073709551615UL>_>
                           ((__normal_iterator<slang::ast::DistExpression::DistItem_*,_std::span<slang::ast::DistExpression::DistItem,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffffd0,
                            (__normal_iterator<slang::ast::DistExpression::DistItem_*,_std::span<slang::ast::DistExpression::DistItem,_18446744073709551615UL>_>
                             *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffd0 =
         (Expression *)
         __gnu_cxx::
         __normal_iterator<slang::ast::DistExpression::DistItem_*,_std::span<slang::ast::DistExpression::DistItem,_18446744073709551615UL>_>
         ::operator*(&local_20);
    Expression::visit<slang::ast::builtins::MonitorVisitor&>
              (in_stack_ffffffffffffffd0,(MonitorVisitor *)in_RDI);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<slang::ast::DistExpression::DistWeight> *)0x13a04ca);
    if (bVar1) {
      std::optional<slang::ast::DistExpression::DistWeight>::operator->
                ((optional<slang::ast::DistExpression::DistWeight> *)0x13a04de);
      Expression::visit<slang::ast::builtins::MonitorVisitor&>
                (in_stack_ffffffffffffffd0,(MonitorVisitor *)in_RDI);
    }
    __gnu_cxx::
    __normal_iterator<slang::ast::DistExpression::DistItem_*,_std::span<slang::ast::DistExpression::DistItem,_18446744073709551615UL>_>
    ::operator++(&local_20);
  }
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<slang::ast::DistExpression::DistWeight> *)0x13a0507);
  if (bVar1) {
    std::optional<slang::ast::DistExpression::DistWeight>::operator->
              ((optional<slang::ast::DistExpression::DistWeight> *)0x13a051a);
    Expression::visit<slang::ast::builtins::MonitorVisitor&>
              (in_stack_ffffffffffffffd0,(MonitorVisitor *)in_RDI);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        left().visit(visitor);
        for (auto& item : items_) {
            item.value.visit(visitor);
            if (item.weight)
                item.weight->expr->visit(visitor);
        }

        if (defaultWeight_)
            defaultWeight_->expr->visit(visitor);
    }